

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.h
# Opt level: O3

void __thiscall
CoreML::Specification::MILSpec::TensorValue_RepeatedFloats::_internal_add_values
          (TensorValue_RepeatedFloats *this,float value)

{
  RepeatedField<float> *this_00;
  uint uVar1;
  float *pfVar2;
  
  this_00 = &this->values_;
  uVar1 = (this->values_).current_size_;
  if (uVar1 == (this->values_).total_size_) {
    google::protobuf::RepeatedField<float>::Reserve(this_00,uVar1 + 1);
    pfVar2 = google::protobuf::RepeatedField<float>::elements(this_00);
    pfVar2[uVar1] = value;
  }
  else {
    pfVar2 = google::protobuf::RepeatedField<float>::elements(this_00);
    pfVar2[uVar1] = value;
  }
  this_00->current_size_ = uVar1 + 1;
  return;
}

Assistant:

inline void TensorValue_RepeatedFloats::_internal_add_values(float value) {
  values_.Add(value);
}